

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc_lowmc.c
# Opt level: O0

void mpc_sbox_prove_uint64_10(uint64_t *in,view_t *view,uint64_t *rvec)

{
  ulong uVar1;
  ulong uVar2;
  long in_RDX;
  view_t *in_RSI;
  long in_RDI;
  uint64_t tmp4;
  uint64_t tmp3;
  uint64_t tmp2;
  uint64_t tmp1;
  uint m_1;
  uint64_t rvecm;
  uint64_t inm;
  uint m;
  uint64_t x2m [3];
  uint64_t x1s [3];
  uint64_t x0s [3];
  uint64_t r2m [3];
  uint64_t r1s [3];
  uint64_t r1m [3];
  uint64_t r0s [3];
  uint64_t r0m [3];
  uint local_134;
  uint local_11c;
  uint64_t local_118 [4];
  uint64_t local_f8 [4];
  uint64_t local_d8 [4];
  uint64_t local_b8 [4];
  uint64_t local_98 [4];
  uint64_t local_78 [4];
  uint64_t local_58 [4];
  uint64_t local_38 [5];
  view_t *local_10;
  long local_8;
  
  for (local_11c = 0; local_11c < 3; local_11c = local_11c + 1) {
    uVar1 = *(ulong *)(in_RDI + (ulong)local_11c * 8);
    uVar2 = *(ulong *)(in_RDX + (ulong)local_11c * 8);
    local_d8[local_11c] = (uVar1 & 0x2492492400000000) << 2;
    local_f8[local_11c] = (uVar1 & 0x4924924800000000) << 1;
    local_118[local_11c] = uVar1 & 0x9249249000000000;
    local_38[local_11c] = uVar2 & 0x2492492400000000;
    local_78[local_11c] = uVar2 & 0x4924924800000000;
    local_b8[local_11c] = uVar2 & 0x9249249000000000;
    local_58[local_11c] = local_38[local_11c] << 2;
    local_98[local_11c] = local_78[local_11c] << 1;
  }
  local_10 = in_RSI;
  local_8 = in_RDI;
  mpc_and_uint64(local_38,local_d8,local_f8,local_b8,in_RSI,0);
  mpc_and_uint64(local_b8,local_f8,local_118,local_98,local_10,1);
  mpc_and_uint64(local_78,local_d8,local_118,local_58,local_10,2);
  for (local_134 = 0; local_134 < 2; local_134 = local_134 + 1) {
    *(ulong *)(local_8 + (ulong)local_134 * 8) =
         *(ulong *)(local_8 + (ulong)local_134 * 8) & 0x3ffffffff ^
         local_d8[local_134] ^ local_f8[local_134] ^ local_38[local_134] ^ local_118[local_134] ^
         (local_b8[local_134] ^ local_d8[local_134]) >> 2 ^
         (local_d8[local_134] ^ local_f8[local_134] ^ local_78[local_134]) >> 1;
  }
  return;
}

Assistant:

static void mpc_sbox_prove_uint64_10(uint64_t* in, view_t* view, uint64_t const* rvec) {
  bitsliced_step_1_uint64_10(SC_PROOF);

  mpc_and_uint64(r0m, x0s, x1s, r2m, view, 0);
  mpc_and_uint64(r2m, x1s, x2m, r1s, view, 1);
  mpc_and_uint64(r1m, x0s, x2m, r0s, view, 2);

  bitsliced_step_2_uint64_10(SC_PROOF - 1);
}